

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

void MBAnalyze(VP8EncIterator *it,int *alphas,int *alpha,int *uv_alpha)

{
  int iVar1;
  int iVar2;
  VP8EncIterator *in_RCX;
  int *in_RDX;
  long in_RSI;
  VP8EncIterator *in_RDI;
  int best_uv_alpha;
  int best_alpha;
  VP8Encoder *enc;
  VP8Encoder *pVVar3;
  
  pVVar3 = in_RDI->enc;
  VP8SetIntra16Mode(in_RCX,(int)((ulong)pVVar3 >> 0x20));
  VP8SetSkip(in_RDI,0);
  VP8SetSegment(in_RDI,0);
  if (pVVar3->method < 2) {
    FastMBAnalyze(it);
  }
  else {
    MBAnalyzeBestIntra16Mode(in_RCX);
  }
  iVar1 = MBAnalyzeBestUVMode(in_RCX);
  iVar2 = FinalAlphaValue(0);
  *(int *)(in_RSI + (long)iVar2 * 4) = *(int *)(in_RSI + (long)iVar2 * 4) + 1;
  in_RDI->mb->alpha = (uint8_t)iVar2;
  *in_RDX = iVar2 + *in_RDX;
  in_RCX->x = iVar1 + in_RCX->x;
  return;
}

Assistant:

static void MBAnalyze(VP8EncIterator* const it,
                      int alphas[MAX_ALPHA + 1],
                      int* const alpha, int* const uv_alpha) {
  const VP8Encoder* const enc = it->enc;
  int best_alpha, best_uv_alpha;

  VP8SetIntra16Mode(it, 0);  // default: Intra16, DC_PRED
  VP8SetSkip(it, 0);         // not skipped
  VP8SetSegment(it, 0);      // default segment, spec-wise.

  if (enc->method <= 1) {
    best_alpha = FastMBAnalyze(it);
  } else {
    best_alpha = MBAnalyzeBestIntra16Mode(it);
  }
  best_uv_alpha = MBAnalyzeBestUVMode(it);

  // Final susceptibility mix
  best_alpha = (3 * best_alpha + best_uv_alpha + 2) >> 2;
  best_alpha = FinalAlphaValue(best_alpha);
  alphas[best_alpha]++;
  it->mb->alpha = best_alpha;   // for later remapping.

  // Accumulate for later complexity analysis.
  *alpha += best_alpha;   // mixed susceptibility (not just luma)
  *uv_alpha += best_uv_alpha;
}